

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O0

void __thiscall
vkt::Draw::DrawTestsBaseClass::DrawTestsBaseClass
          (DrawTestsBaseClass *this,Context *context,char *vertexShaderName,char *fragmentShaderName
          ,VkPrimitiveTopology topology)

{
  char *pcVar1;
  DeviceInterface *pDVar2;
  allocator<char> local_3e;
  allocator<char> local_3d [17];
  VkPrimitiveTopology local_2c;
  char *pcStack_28;
  VkPrimitiveTopology topology_local;
  char *fragmentShaderName_local;
  char *vertexShaderName_local;
  Context *context_local;
  DrawTestsBaseClass *this_local;
  
  local_2c = topology;
  pcStack_28 = fragmentShaderName;
  fragmentShaderName_local = vertexShaderName;
  vertexShaderName_local = (char *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DrawTestsBaseClass_016ae160;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_topology = local_2c;
  pDVar2 = Context::getDeviceInterface((Context *)vertexShaderName_local);
  this->m_vk = pDVar2;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_colorTargetImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorTargetView);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_vertexBuffer);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_vertexRefDataBuffer);
  PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  pcVar1 = fragmentShaderName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,pcVar1,local_3d);
  std::allocator<char>::~allocator(local_3d);
  pcVar1 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,pcVar1,&local_3e);
  std::allocator<char>::~allocator(&local_3e);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::vector
            (&this->m_data);
  return;
}

Assistant:

DrawTestsBaseClass::DrawTestsBaseClass (Context& context, const char* vertexShaderName, const char* fragmentShaderName, vk::VkPrimitiveTopology topology)
	: TestInstance				(context)
	, m_colorAttachmentFormat	(vk::VK_FORMAT_R8G8B8A8_UNORM)
	, m_topology				(topology)
	, m_vk						(context.getDeviceInterface())
	, m_vertexShaderName		(vertexShaderName)
	, m_fragmentShaderName		(fragmentShaderName)
{
}